

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O1

Result<wasm::Literal> *
wasm::WATParser::anon_unknown_21::const_(Result<wasm::Literal> *__return_storage_ptr__,Lexer *in)

{
  undefined8 *puVar1;
  bool bVar2;
  optional<unsigned_int> oVar3;
  _Alloc_hider _Var4;
  string_view expected;
  undefined1 local_98 [8];
  Literal lit;
  size_type local_70 [2];
  string local_60;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  expected._M_str = "ref.extern";
  expected._M_len = 10;
  bVar2 = Lexer::takeSExprStart(in,expected);
  if (!bVar2) {
    parseConst(__return_storage_ptr__,in);
    return __return_storage_ptr__;
  }
  oVar3 = Lexer::takeI<unsigned_int>(in);
  if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    lit.type.id = (uintptr_t)local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&lit.type,"expected host reference payload","");
    Lexer::err((Err *)&local_40.func,in,(string *)&lit.type);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
                     super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Variant_storage_alias<wasm::Literal,_wasm::Err> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.i64 == &local_30) {
      *puVar1 = CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 0x18) = local_30._8_8_;
    }
    else {
      *(int64_t *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Variant_storage_alias<wasm::Literal,_wasm::Err> = local_40.i64;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 0x10) =
           CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]);
    }
    *(char **)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 8) =
         local_40.func.super_IString.str._M_str;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
             super__Move_assign_alias<wasm::Literal,_wasm::Err>.
             super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
             super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
             super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 0x20) = '\x01';
    local_60.field_2._M_allocated_capacity = local_70[0];
    _Var4._M_p = (pointer)lit.type;
    if ((size_type *)lit.type.id == local_70) {
      return __return_storage_ptr__;
    }
  }
  else {
    bVar2 = Lexer::takeRParen(in);
    if (bVar2) {
      Literal::Literal((Literal *)local_98,(Type)0x30);
      local_98._0_4_ =
           oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload | 0x80000000;
      Literal::externalize((Literal *)&local_40.func,(Literal *)local_98);
      Literal::Literal((Literal *)__return_storage_ptr__,(Literal *)&local_40.func);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 0x20) = '\0';
      Literal::~Literal((Literal *)&local_40.func);
      Literal::~Literal((Literal *)local_98);
      return __return_storage_ptr__;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"expected end of ref.extern","");
    Lexer::err((Err *)&local_40.func,in,&local_60);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
                     super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Variant_storage_alias<wasm::Literal,_wasm::Err> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.i64 == &local_30) {
      *puVar1 = CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
               super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 0x18) = local_30._8_8_;
    }
    else {
      *(int64_t *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Variant_storage_alias<wasm::Literal,_wasm::Err> = local_40.i64;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 0x10) =
           CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]);
    }
    *(char **)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 8) =
         local_40.func.super_IString.str._M_str;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Literal,_wasm::Err>.
             super__Move_assign_alias<wasm::Literal,_wasm::Err>.
             super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
             super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
             super__Variant_storage_alias<wasm::Literal,_wasm::Err> + 0x20) = '\x01';
    _Var4._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
  }
  local_40.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_30;
  local_30._M_local_buf[0] = '\0';
  local_40.func.super_IString.str._M_str = (char *)0x0;
  operator_delete(_Var4._M_p,local_60.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result<Literal> const_(Lexer& in) {
  if (in.takeSExprStart("ref.extern"sv)) {
    auto n = in.takeI32();
    if (!n) {
      return in.err("expected host reference payload");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of ref.extern");
    }
    // Represent host references as externalized i31s.
    return Literal::makeI31(*n, Unshared).externalize();
  }
  return parseConst(in);
}